

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

bool Assimp::IFC::TryAddOpenings_Poly2Tri
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  pointer paVar3;
  element_type *peVar4;
  pointer pIVar5;
  iterator __position;
  double *pdVar6;
  iterator __position_00;
  iterator __position_01;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  pointer pIVar9;
  CDT *this;
  pointer pvVar10;
  pointer pvVar11;
  pointer paVar12;
  pointer ppOVar13;
  bool bVar14;
  IntPoint *pIVar15;
  ulong uVar16;
  double *pdVar17;
  IntPoint *pIVar18;
  double *pdVar19;
  IntPoint *pIVar20;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  IfcVector3 *xx;
  pointer paVar21;
  pointer pTVar22;
  IfcVector2 *pip_1;
  pointer paVar23;
  pointer pIVar24;
  IfcVector2 *pip;
  pointer pEVar25;
  Point *pPVar26;
  IfcVector3 *x;
  pointer pTVar27;
  undefined8 uVar28;
  IntPoint *point;
  long lVar29;
  pointer pvVar30;
  double dVar31;
  undefined1 auVar32 [16];
  IntPoint IVar33;
  undefined1 auVar34 [16];
  aiVector2t<double> aVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour;
  Polygon hole;
  bool ok;
  Polygon *__range3;
  aiVector3t<double> res_1;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  contours;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> contour_points;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcMatrix3 m;
  Polygons holes_union;
  ExPolygons clipped;
  IfcVector3 nor;
  Clipper clipper_holes;
  aiVector3t<double> local_438;
  IntPoint local_418;
  IntPoint *local_408;
  bool local_3f1;
  pointer local_3f0;
  IntPoint local_3e8;
  double local_3d8;
  undefined4 local_3bc;
  CDT *local_3b8;
  undefined8 uStack_3b0;
  pointer local_3a0;
  undefined1 local_398 [12];
  undefined4 uStack_38c;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  local_388;
  undefined1 local_368 [16];
  pointer local_358;
  pointer local_350;
  pointer local_348;
  pointer pTStack_340;
  CDT *local_338;
  CDT *pCStack_330;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> local_328;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_308;
  IfcMatrix3 local_2e8;
  Polygons local_298;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  double local_258;
  double dStack_250;
  ExPolygons local_248;
  pointer local_228;
  undefined8 uStack_220;
  Point *local_218;
  Point *pPStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  pointer local_1f8;
  pointer local_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  IfcVector3 local_1c8;
  Clipper local_1a8;
  
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b3862);
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_1c8.z = 0.0;
  DerivePlaneCoordinateSpace(&local_2e8,curmesh,&local_3f1,&local_1c8);
  if (local_3f1 == true) {
    dVar31 = local_2e8.b1 * -local_2e8.a2;
    dVar42 = -local_2e8.a3;
    local_258 = local_2e8.b2 * dVar42 * local_2e8.c1 +
                local_2e8.a3 * local_2e8.b1 * local_2e8.c2 +
                dVar31 * local_2e8.c3 +
                local_2e8.a2 * local_2e8.b3 * local_2e8.c1 +
                (local_2e8.a1 * local_2e8.b2 * local_2e8.c3 -
                local_2e8.b3 * local_2e8.a1 * local_2e8.c2);
    if ((local_258 != 0.0) || (NAN(local_258))) {
      local_258 = 1.0 / local_258;
      uStack_200 = -local_258;
      local_1e8 = (local_2e8.b1 * local_2e8.c3 - local_2e8.c1 * local_2e8.b3) * uStack_200;
      dStack_1e0 = (local_2e8.b2 * local_2e8.c3 - local_2e8.c2 * local_2e8.b3) * local_258;
      local_268._8_8_ = local_258 * (local_2e8.b3 * local_2e8.a2 + local_2e8.b2 * dVar42);
      local_268._0_8_ = uStack_200 * (local_2e8.b3 * local_2e8.a1 + dVar42 * local_2e8.b1);
      local_1d8 = (local_2e8.c3 * local_2e8.a1 + dVar42 * local_2e8.c1) * local_258;
      dStack_1d0 = (local_2e8.c3 * local_2e8.a2 + dVar42 * local_2e8.c2) * uStack_200;
      local_208 = (local_2e8.b1 * local_2e8.c2 + -local_2e8.b2 * local_2e8.c1) * local_258;
      uStack_200 = (local_2e8.a1 * local_2e8.c2 + -local_2e8.a2 * local_2e8.c1) * uStack_200;
      local_258 = (local_2e8.b2 * local_2e8.a1 + dVar31) * local_258;
      dStack_250 = local_2e8.b2;
    }
    else {
      local_258 = NAN;
      dStack_250 = 0.0;
      local_1e8 = NAN;
      dStack_1e0 = NAN;
      local_1d8 = NAN;
      dStack_1d0 = NAN;
      local_268._8_8_ = 0x7ff8000000000000;
      local_268._0_8_ = 0x7ff8000000000000;
      local_208 = NAN;
      uStack_200 = NAN;
    }
    local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (aiVector2t<double> *)0x0;
    local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (aiVector2t<double> *)0x0;
    local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (aiVector2t<double> *)0x0;
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (&local_308,
               ((long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    paVar21 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar3 = (curmesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_3a0 = (pointer)nors;
    if (paVar21 == paVar3) {
      local_368._0_8_ = -10000000000.0;
      dVar31 = -10000000000.0;
      local_398._0_8_ = 10000000000.0;
      unique0x10000da3 = 10000000000.0;
      local_3b8 = (CDT *)0xbff0000000000000;
      uStack_3b0 = 0;
    }
    else {
      local_368._8_8_ = 0xc202a05f20000000;
      local_368._0_8_ = 0xc202a05f20000000;
      stack0xfffffffffffffc70 = 10000000000.0;
      local_398._0_8_ = 0x4202a05f20000000;
      do {
        local_228 = (pointer)paVar21->x;
        local_338 = (CDT *)paVar21->y;
        local_278 = (vector<unsigned_int,std::allocator<unsigned_int>> *)paVar21->z;
        local_348 = (pointer)local_2e8.c1;
        local_3f0 = (pointer)local_2e8.c2;
        local_3b8 = (CDT *)local_2e8.c3;
        uStack_3b0 = 0;
        pCStack_330 = (CDT *)0x0;
        uStack_220 = 0;
        uStack_270 = 0;
        local_218 = (Point *)((double)local_278 * local_2e8.a3 +
                             (double)local_228 * local_2e8.a1 + local_2e8.a2 * (double)local_338);
        pPStack_210 = (Point *)((double)local_278 * local_2e8.b3 +
                               (double)local_228 * local_2e8.b1 + local_2e8.b2 * (double)local_338);
        local_1a8._vptr_Clipper = (_func_int **)local_218;
        local_1a8.m_PolyOuts.
        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pPStack_210;
        if (local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_308,
                     (iterator)
                     local_308.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(aiVector2t<double> *)&local_1a8);
        }
        else {
          (local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->x = (double)local_218;
          (local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->y = (double)pPStack_210;
          local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_308.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        auVar40._8_8_ = pPStack_210;
        auVar40._0_8_ = local_218;
        _local_398 = minpd(_local_398,auVar40);
        local_368 = maxpd(local_368,auVar40);
        dVar31 = local_368._8_8_;
        paVar21 = paVar21 + 1;
      } while (paVar21 != paVar3);
      local_3b8 = (CDT *)((double)local_3b8 * (double)local_278 +
                         (double)local_348 * (double)local_228 +
                         (double)local_338 * (double)local_3f0);
    }
    pEVar25 = local_3a0;
    local_368._0_8_ = (double)local_368._0_8_ - (double)local_398._0_8_;
    local_218 = (Point *)(dVar31 - register0x00001208);
    local_368._8_8_ = local_218;
    dVar31 = SQRT((double)local_368._0_8_ * (double)local_368._0_8_ +
                  (double)local_218 * (double)local_218);
    pPStack_210 = local_218;
    if ((dVar31 == 0.0) && (!NAN(dVar31))) {
      __assert_fail("vmax.Length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x5dc,
                    "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                   );
    }
    local_248.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ClipperLib::Clipper::Clipper(&local_1a8);
    pTVar27 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar22 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar27 != pTVar22) {
      local_338 = local_3b8;
      pCStack_330 = local_3b8;
      lVar29 = 0;
      local_348 = pTVar22;
      do {
        paVar21 = (((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                   &pEVar25->outer)->_M_impl).super__Vector_impl_data._M_start;
        if ((0.9999989867210388 <=
             ABS(local_1c8.z * paVar21[lVar29].z +
                 local_1c8.x * paVar21[lVar29].x + local_1c8.y * paVar21[lVar29].y)) &&
           (peVar4 = (pTVar27->profileMesh).
                     super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           2 < (ulong)(((long)(peVar4->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar4->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
           )) {
          local_438.x = 0.0;
          local_438.y = 0.0;
          local_438.z = 0.0;
          paVar21 = (peVar4->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar3 = (peVar4->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (paVar21 == paVar3) {
            local_418 = (IntPoint)ZEXT816(0);
            local_408 = (IntPoint *)0x0;
          }
          else {
            do {
              dVar31 = paVar21->x;
              dVar42 = paVar21->y;
              dVar38 = paVar21->z;
              dVar43 = dVar38 * local_2e8.b3 + dVar31 * local_2e8.b1 + dVar42 * local_2e8.b2;
              local_418.Y._0_4_ = SUB84(dVar43,0);
              local_418.X = (long64)(dVar38 * local_2e8.a3 +
                                    dVar31 * local_2e8.a1 + dVar42 * local_2e8.a2);
              local_418.Y._4_4_ = (int)((ulong)dVar43 >> 0x20);
              dVar43 = (pTVar27->extrusionDir).x + dVar31;
              dVar44 = (pTVar27->extrusionDir).y + dVar42;
              dVar45 = (pTVar27->extrusionDir).z + dVar38;
              local_3e8.X = (long64)(dVar45 * local_2e8.a3 +
                                    dVar43 * local_2e8.a1 + dVar44 * local_2e8.a2);
              local_3e8.Y = (long64)(dVar45 * local_2e8.b3 +
                                    dVar43 * local_2e8.b1 + dVar44 * local_2e8.b2);
              local_408 = (IntPoint *)
                          (local_2e8.c3 * dVar38 + local_2e8.c1 * dVar31 + local_2e8.c2 * dVar42);
              local_3d8 = local_2e8.c3 * dVar45 + local_2e8.c1 * dVar43 + local_2e8.c2 * dVar44;
              pIVar15 = &local_418;
              if (ABS(local_3d8 - (double)pCStack_330) < ABS((double)local_408 - (double)local_338))
              {
                pIVar15 = &local_3e8;
              }
              local_388.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               *)&pIVar15->X)->_M_impl).super__Vector_impl_data._M_start;
              local_388.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar15->Y;
              local_418 = *pIVar15;
              local_408 = (IntPoint *)pIVar15[1].X;
              if (local_438.y == local_438.z) {
                std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
                _M_realloc_insert<aiVector2t<double>>
                          ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)
                           &local_438,(iterator)local_438.y,(aiVector2t<double> *)&local_388);
              }
              else {
                *(double *)local_438.y =
                     (double)local_388.
                             super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                *(pointer *)((long)local_438.y + 8) =
                     local_388.
                     super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_438.y = (double)((long)local_438.y + 0x10);
              }
              dVar31 = local_438.y;
              paVar21 = paVar21 + 1;
            } while (paVar21 != paVar3);
            local_418 = (IntPoint)ZEXT816(0);
            local_408 = (IntPoint *)0x0;
            for (pIVar15 = (IntPoint *)local_438.x; pIVar15 != (IntPoint *)dVar31;
                pIVar15 = pIVar15 + 1) {
              auVar32._0_8_ = (double)pIVar15->X - (double)local_398._0_8_;
              auVar32._8_8_ = (double)pIVar15->Y - stack0xfffffffffffffc70;
              IVar33 = (IntPoint)divpd(auVar32,local_368);
              dVar42 = (double)IVar33.X * 1518500249.0;
              uVar16 = (ulong)dVar42;
              *pIVar15 = IVar33;
              local_3e8.X = (long)(dVar42 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16;
              dVar42 = (double)IVar33.Y * 1518500249.0;
              uVar16 = (ulong)dVar42;
              local_3e8.Y = (long)(dVar42 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16;
              if ((IntPoint *)local_418.Y == local_408) {
                std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                _M_realloc_insert<ClipperLib::IntPoint>
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           &local_418,(iterator)local_418.Y,&local_3e8);
              }
              else {
                *(long64 *)local_418.Y = local_3e8.X;
                *(long64 *)(local_418.Y + 8) = local_3e8.Y;
                local_418.Y = (long64)(local_418.Y + 0x10);
              }
            }
          }
          bVar14 = ClipperLib::Orientation((Polygon *)&local_418);
          pTVar22 = local_348;
          pEVar25 = local_3a0;
          if (!bVar14) {
            pdVar19 = (double *)(local_418.Y + -0x10);
            pdVar6 = (double *)local_418.X;
            if ((ulong)local_418.X < pdVar19 && local_418.X != local_418.Y) {
              do {
                pdVar17 = pdVar6 + 2;
                local_3e8.X = (long64)*pdVar6;
                local_3e8.Y = (long64)pdVar6[1];
                dVar31 = pdVar19[1];
                *pdVar6 = *pdVar19;
                pdVar6[1] = dVar31;
                *pdVar19 = (double)local_3e8.X;
                pdVar19[1] = (double)local_3e8.Y;
                pdVar19 = pdVar19 + -2;
                pdVar6 = pdVar17;
              } while (pdVar17 < pdVar19);
            }
          }
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)
                     ((long)&local_1a8._vptr_Clipper +
                     (long)(((Point *)((long)local_1a8._vptr_Clipper + -0x28))->edge_list).
                           super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
                           super__Vector_impl_data._M_start),(Polygon *)&local_418,ptSubject);
          if ((void *)local_418.X != (void *)0x0) {
            operator_delete((void *)local_418.X);
          }
          if ((IntPoint *)local_438.x != (IntPoint *)0x0) {
            operator_delete((void *)local_438.x);
          }
        }
        lVar29 = lVar29 + 1;
        pTVar27 = pTVar27 + 1;
      } while (pTVar27 != pTVar22);
    }
    ClipperLib::Clipper::Execute(&local_1a8,ctUnion,&local_298,pftNonZero,pftNonZero);
    paVar12 = local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_298.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_298.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ClipperLib::Clipper::~Clipper(&local_1a8);
      bVar14 = false;
    }
    else {
      local_438.x = 0.0;
      local_438.y = 0.0;
      local_438.z = 0.0;
      if (local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar23 = local_308.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          auVar34._0_8_ = paVar23->x - (double)local_398._0_8_;
          auVar34._8_8_ = paVar23->y - stack0xfffffffffffffc70;
          aVar35 = (aiVector2t<double>)divpd(auVar34,local_368);
          dVar31 = aVar35.x * 1518500249.0;
          uVar16 = (ulong)dVar31;
          *paVar23 = aVar35;
          local_418.X = (long)(dVar31 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16;
          dVar31 = aVar35.y * 1518500249.0;
          uVar16 = (ulong)dVar31;
          local_418.Y = (long)(dVar31 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16;
          if (local_438.y == local_438.z) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            _M_realloc_insert<ClipperLib::IntPoint>
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &local_438,(iterator)local_438.y,&local_418);
          }
          else {
            *(long64 *)local_438.y = local_418.X;
            *(long64 *)((long)local_438.y + 8) = local_418.Y;
            local_438.y = (double)((long)local_438.y + 0x10);
          }
          paVar23 = paVar23 + 1;
        } while (paVar23 != paVar12);
      }
      bVar14 = ClipperLib::Orientation((Polygon *)&local_438);
      if ((bVar14) &&
         (pIVar20 = (IntPoint *)((long)local_438.y + -0x10), pIVar15 = (IntPoint *)local_438.x,
         (ulong)local_438.x < pIVar20 && local_438.x != local_438.y)) {
        do {
          pIVar18 = pIVar15 + 1;
          dVar31 = (double)pIVar15->X;
          dVar42 = (double)pIVar15->Y;
          local_418 = *pIVar15;
          dVar38 = (double)pIVar20->Y;
          pIVar15->X = pIVar20->X;
          pIVar15->Y = (long64)dVar38;
          pIVar20->X = (long64)dVar31;
          pIVar20->Y = (long64)dVar42;
          pIVar20 = pIVar20 + -1;
          pIVar15 = pIVar18;
        } while (pIVar18 < pIVar20);
      }
      ClipperLib::Clipper::Clear(&local_1a8);
      ClipperLib::ClipperBase::AddPolygon
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 (long)(((Point *)((long)local_1a8._vptr_Clipper + -0x28))->edge_list).
                       super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
                       super__Vector_impl_data._M_start),(Polygon *)&local_438,ptSubject);
      ClipperLib::ClipperBase::AddPolygons
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 (long)(((Point *)((long)local_1a8._vptr_Clipper + -0x28))->edge_list).
                       super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
                       super__Vector_impl_data._M_start),&local_298,ptClip);
      ClipperLib::Clipper::Execute(&local_1a8,ctDifference,&local_248,pftNonZero,pftNonZero);
      if ((IntPoint *)local_438.x != (IntPoint *)0x0) {
        operator_delete((void *)local_438.x);
      }
      ClipperLib::Clipper::~Clipper(&local_1a8);
      local_350 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_1f0 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_278 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&curmesh->mVertcnt;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1f8 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f0 = local_248.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_3a0 = local_248.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (local_248.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_248.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_350,local_1f0);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_278,
                   (curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_358,local_1f8);
        LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5b4b6a);
        bVar14 = false;
      }
      else {
        local_268._0_8_ = (double)local_268._0_8_ * (double)local_3b8;
        local_268._8_8_ = (double)local_268._8_8_ * (double)local_3b8;
        auVar7._4_8_ = local_3b8;
        auVar7._0_4_ = local_398._4_4_;
        auVar36._0_8_ = auVar7._0_8_ << 0x20;
        auVar36._8_4_ = local_398._8_4_;
        auVar36._12_4_ = uStack_38c;
        local_338 = auVar36._8_8_;
        auVar8._4_8_ = local_338;
        auVar8._0_4_ = local_208._4_4_;
        auVar37._0_8_ = auVar8._0_8_ << 0x20;
        auVar37._8_4_ = (undefined4)uStack_200;
        auVar37._12_4_ = uStack_200._4_4_;
        local_348 = auVar37._8_8_;
        uVar28 = 0;
        local_258 = local_258 * (double)local_3b8;
        pTStack_340 = local_348;
        pCStack_330 = local_338;
        do {
          pvVar11 = local_388.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pvVar10 = local_388.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_3bc = (undefined4)uVar28;
          pIVar24 = (pointer)local_388.
                             super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          if (local_388.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_388.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              if ((void *)pIVar24->X != (void *)0x0) {
                operator_delete((void *)pIVar24->X);
              }
              pIVar5 = pIVar24 + 1;
              pIVar24 = (pointer)&pIVar5->Y;
            } while ((pointer)&pIVar5->Y != pvVar11);
            local_388.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar10;
          }
          local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (Point **)0x0;
          local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (Point **)0x0;
          paVar3 = (((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                    &local_3f0->outer)->_M_impl).super__Vector_impl_data._M_finish;
          for (paVar21 = (((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                           )&local_3f0->outer)->_M_impl).super__Vector_impl_data._M_start;
              paVar21 != paVar3; paVar21 = (pointer)&paVar21->z) {
            local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
            auVar39._0_8_ = (double)(long)paVar21->x;
            auVar39._8_8_ = (double)(long)paVar21->y;
            auVar40 = divpd(auVar39,_DAT_007867a0);
            ((Point *)local_1a8._vptr_Clipper)->x = (double)auVar40._0_8_;
            ((Point *)local_1a8._vptr_Clipper)->y = (double)auVar40._8_8_;
            (((Point *)local_1a8._vptr_Clipper)->edge_list).
            super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (((Point *)local_1a8._vptr_Clipper)->edge_list).
            super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (((Point *)local_1a8._vptr_Clipper)->edge_list).
            super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<p2t::Point*,std::allocator<p2t::Point*>>::_M_realloc_insert<p2t::Point*>
                        ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&local_328,
                         (iterator)
                         local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Point **)&local_1a8);
            }
            else {
              *local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
               super__Vector_impl_data._M_finish = (Point *)local_1a8._vptr_Clipper;
              local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          local_3b8 = (CDT *)operator_new(0x10);
          p2t::CDT::CDT(local_3b8,&local_328);
          pvVar30 = (local_3f0->holes).
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_228 = (local_3f0->holes).
                      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (pvVar30 != local_228) {
            do {
              local_1a8._vptr_Clipper = (_func_int **)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              std::
              vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
              ::emplace_back<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>
                        ((vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
                          *)&local_388,
                         (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&local_1a8);
              if ((Point *)local_1a8._vptr_Clipper != (Point *)0x0) {
                operator_delete(local_1a8._vptr_Clipper);
              }
              pvVar10 = local_388.
                        super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pIVar9 = (pointer)((long)local_388.
                                       super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + -0x20);
              pIVar5 = (pvVar30->
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pIVar24 = (pvVar30->
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             )._M_impl.super__Vector_impl_data._M_start; pIVar24 != pIVar5;
                  pIVar24 = pIVar24 + 1) {
                local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
                auVar41._0_8_ = (double)pIVar24->X;
                auVar41._8_8_ = (double)pIVar24->Y;
                auVar40 = divpd(auVar41,_DAT_007867a0);
                ((Point *)local_1a8._vptr_Clipper)->x = (double)auVar40._0_8_;
                ((Point *)local_1a8._vptr_Clipper)->y = (double)auVar40._8_8_;
                (((Point *)local_1a8._vptr_Clipper)->edge_list).
                super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (((Point *)local_1a8._vptr_Clipper)->edge_list).
                super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (((Point *)local_1a8._vptr_Clipper)->edge_list).
                super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                __position._M_current = (Point **)((pointer)((long)pvVar10 + -0x10))->X;
                if (__position._M_current == (Point **)((pointer)((long)pvVar10 + -0x10))->Y) {
                  std::vector<p2t::Point*,std::allocator<p2t::Point*>>::
                  _M_realloc_insert<p2t::Point*>
                            ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&pIVar9->Y,
                             __position,(Point **)&local_1a8);
                }
                else {
                  *__position._M_current = (Point *)local_1a8._vptr_Clipper;
                  ((pointer)((long)pvVar10 + -0x10))->X = ((pointer)((long)pvVar10 + -0x10))->X + 8;
                }
              }
              p2t::CDT::AddHole(local_3b8,
                                (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&pIVar9->Y);
              pvVar30 = pvVar30 + 1;
            } while (pvVar30 != local_228);
          }
          this = local_3b8;
          p2t::CDT::Triangulate(local_3b8);
          p2t::CDT::GetTriangles
                    ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&local_1a8,this);
          ppOVar13 = local_1a8.m_PolyOuts.
                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          for (pPVar26 = (Point *)local_1a8._vptr_Clipper; pPVar26 != (Point *)ppOVar13;
              pPVar26 = (Point *)&pPVar26->y) {
            dVar31 = pPVar26->x;
            lVar29 = 1;
            do {
              pdVar6 = *(double **)((long)dVar31 + lVar29 * 8);
              dVar42 = *pdVar6;
              if ((((1.0 < dVar42) || (dVar42 < 0.0)) || (dVar38 = pdVar6[1], 1.0 < dVar38)) ||
                 (dVar38 < 0.0)) {
                __assert_fail("v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                              ,0x68a,
                              "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                             );
              }
              dVar42 = dVar42 * (double)local_368._0_8_ + (double)local_398._0_8_;
              dVar38 = dVar38 * (double)local_218 + (double)local_338;
              local_438.y = dVar42 * local_1e8 + dVar38 * local_1d8 + (double)local_268._0_8_;
              local_438.x = dVar42 * dStack_1e0 + dVar38 * dStack_1d0 + (double)local_268._8_8_;
              local_438.z = local_208 * dVar42 + (double)local_348 * dVar38 + local_258;
              __position_00._M_current =
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                           __position_00,&local_438);
              }
              else {
                (__position_00._M_current)->z = local_438.z;
                (__position_00._M_current)->x = local_438.x;
                (__position_00._M_current)->y = local_438.y;
                ppaVar1 = &(curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != 4);
            local_438.x = (double)CONCAT44(local_438.x._4_4_,3);
            __position_01._M_current =
                 (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position_01._M_current ==
                (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278,
                         __position_01,(uint *)&local_438);
            }
            else {
              *__position_01._M_current = 3;
              ppuVar2 = &(curmesh->mVertcnt).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar2 = *ppuVar2 + 1;
            }
          }
          if ((Point *)local_1a8._vptr_Clipper != (Point *)0x0) {
            operator_delete(local_1a8._vptr_Clipper);
          }
          uVar28 = CONCAT71((int7)((ulong)this >> 8),1);
          if (local_328.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_328.
                            super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          local_3f0 = local_3f0 + 1;
        } while (local_3f0 != local_3a0);
        bVar14 = true;
      }
      std::
      vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ::~vector(&local_388);
      if (local_358 != (pointer)0x0) {
        operator_delete(local_358);
      }
      if (local_350 != (pointer)0x0) {
        operator_delete(local_350);
      }
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector(&local_298);
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&local_248);
    if (local_308.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (aiVector2t<double> *)0x0) {
      operator_delete(local_308.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool TryAddOpenings_Poly2Tri(const std::vector<TempOpening>& openings,const std::vector<IfcVector3>& nors,
    TempMesh& curmesh)
{
    IFCImporter::LogWarn("forced to use poly2tri fallback method to generate wall openings");
    std::vector<IfcVector3>& out = curmesh.mVerts;

    bool result = false;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system.
    bool ok;
    IfcVector3 nor;
    const IfcMatrix3 m = DerivePlaneCoordinateSpace(curmesh, ok, nor);
    if (!ok) {
        return false;
    }

    const IfcMatrix3 minv = IfcMatrix3(m).Inverse();


    IfcFloat coord = -1;

    std::vector<IfcVector2> contour_flat;
    contour_flat.reserve(out.size());

    IfcVector2 vmin, vmax;
    MinMaxChooser<IfcVector2>()(vmin, vmax);

    // Move all points into the new coordinate system, collecting min/max verts on the way
    for(IfcVector3& x : out) {
        const IfcVector3 vv = m * x;

        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).


        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }

        coord = vv.z;

        vmin = std::min(IfcVector2(vv.x, vv.y), vmin);
        vmax = std::max(IfcVector2(vv.x, vv.y), vmax);

        contour_flat.push_back(IfcVector2(vv.x,vv.y));
    }

    // With the current code in DerivePlaneCoordinateSpace,
    // vmin,vmax should always be the 0...1 rectangle (+- numeric inaccuracies)
    // but here we won't rely on this.

    vmax -= vmin;

    // If this happens then the projection must have been wrong.
    ai_assert(vmax.Length());

    ClipperLib::ExPolygons clipped;
    ClipperLib::Polygons holes_union;


    IfcVector3 wall_extrusion;
    bool first = true;

    try {

        ClipperLib::Clipper clipper_holes;
        size_t c = 0;

        for(const TempOpening& t :openings) {
            const IfcVector3& outernor = nors[c++];
            const IfcFloat dot = nor * outernor;
            if (std::fabs(dot)<1.f-1e-6f) {
                continue;
            }

            const std::vector<IfcVector3>& va = t.profileMesh->mVerts;
            if(va.size() <= 2) {
                continue;
            }

            std::vector<IfcVector2> contour;

            for(const IfcVector3& xx : t.profileMesh->mVerts) {
                IfcVector3 vv = m *  xx, vv_extr = m * (xx + t.extrusionDir);

                const bool is_extruded_side = std::fabs(vv.z - coord) > std::fabs(vv_extr.z - coord);
                if (first) {
                    first = false;
                    if (dot > 0.f) {
                        wall_extrusion = t.extrusionDir;
                        if (is_extruded_side) {
                            wall_extrusion = - wall_extrusion;
                        }
                    }
                }

                // XXX should not be necessary - but it is. Why? For precision reasons?
                vv = is_extruded_side ? vv_extr : vv;
                contour.push_back(IfcVector2(vv.x,vv.y));
            }

            ClipperLib::Polygon hole;
            for(IfcVector2& pip : contour) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                hole.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            }

            if (!ClipperLib::Orientation(hole)) {
                std::reverse(hole.begin(), hole.end());
            //  assert(ClipperLib::Orientation(hole));
            }

            /*ClipperLib::Polygons pol_temp(1), pol_temp2(1);
            pol_temp[0] = hole;

            ClipperLib::OffsetPolygons(pol_temp,pol_temp2,5.0);
            hole = pol_temp2[0];*/

            clipper_holes.AddPolygon(hole,ClipperLib::ptSubject);
        }

        clipper_holes.Execute(ClipperLib::ctUnion,holes_union,
            ClipperLib::pftNonZero,
            ClipperLib::pftNonZero);

        if (holes_union.empty()) {
            return false;
        }

        // Now that we have the big union of all holes, subtract it from the outer contour
        // to obtain the final polygon to feed into the triangulator.
        {
            ClipperLib::Polygon poly;
            for(IfcVector2& pip : contour_flat) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                poly.push_back(ClipperLib::IntPoint( to_int64(pip.x), to_int64(pip.y) ));
            }

            if (ClipperLib::Orientation(poly)) {
                std::reverse(poly.begin(), poly.end());
            }
            clipper_holes.Clear();
            clipper_holes.AddPolygon(poly,ClipperLib::ptSubject);

            clipper_holes.AddPolygons(holes_union,ClipperLib::ptClip);
            clipper_holes.Execute(ClipperLib::ctDifference,clipped,
                ClipperLib::pftNonZero,
                ClipperLib::pftNonZero);
        }

    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, skipping openings for this face: (Clipper: "
            + std::string(sx) + ")");

        return false;
    }

    std::vector<IfcVector3> old_verts;
    std::vector<unsigned int> old_vertcnt;

    old_verts.swap(curmesh.mVerts);
    old_vertcnt.swap(curmesh.mVertcnt);

    std::vector< std::vector<p2t::Point*> > contours;
    for(ClipperLib::ExPolygon& clip : clipped) {

        contours.clear();

        // Build the outer polygon contour line for feeding into poly2tri
        std::vector<p2t::Point*> contour_points;
        for(ClipperLib::IntPoint& point : clip.outer) {
            contour_points.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
        }

        p2t::CDT* cdt ;
        try {
            // Note: this relies on custom modifications in poly2tri to raise runtime_error's
            // instead if assertions. These failures are not debug only, they can actually
            // happen in production use if the input data is broken. An assertion would be
            // inappropriate.
            cdt = new p2t::CDT(contour_points);
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }


        // Build the poly2tri inner contours for all holes we got from ClipperLib
        for(ClipperLib::Polygon& opening : clip.holes) {

            contours.push_back(std::vector<p2t::Point*>());
            std::vector<p2t::Point*>& contour = contours.back();

            for(ClipperLib::IntPoint& point : opening) {
                contour.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
            }

            cdt->AddHole(contour);
        }

        try {
            // Note: See above
            cdt->Triangulate();
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }

        const std::vector<p2t::Triangle*> tris = cdt->GetTriangles();

        // Collect the triangles we just produced
        for(p2t::Triangle* tri : tris) {
            for(int i = 0; i < 3; ++i) {

                const IfcVector2 v = IfcVector2(
                    static_cast<IfcFloat>( tri->GetPoint(i)->x ),
                    static_cast<IfcFloat>( tri->GetPoint(i)->y )
                );

                ai_assert(v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0);
                const IfcVector3 v3 = minv * IfcVector3(vmin.x + v.x * vmax.x, vmin.y + v.y * vmax.y,coord) ;

                curmesh.mVerts.push_back(v3);
            }
            curmesh.mVertcnt.push_back(3);
        }

        result = true;
    }

    if (!result) {
        // revert -- it's a shame, but better than nothing
        curmesh.mVerts.insert(curmesh.mVerts.end(),old_verts.begin(), old_verts.end());
        curmesh.mVertcnt.insert(curmesh.mVertcnt.end(),old_vertcnt.begin(), old_vertcnt.end());

        IFCImporter::LogError("Ifc: revert, could not generate openings for this wall");
    }

    return result;
}